

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3StringAppend(StrBuffer *pStr,char *zAppend,int nAppend)

{
  size_t sVar1;
  char *pOld;
  long lVar2;
  int iVar3;
  
  if (nAppend < 0) {
    sVar1 = strlen(zAppend);
    nAppend = (int)sVar1;
  }
  iVar3 = pStr->n;
  pOld = pStr->z;
  if (pStr->nAlloc <= nAppend + iVar3 + 1) {
    iVar3 = nAppend + pStr->nAlloc + 100;
    pOld = (char *)sqlite3_realloc(pOld,iVar3);
    if (pOld == (char *)0x0) {
      return 7;
    }
    pStr->z = pOld;
    pStr->nAlloc = iVar3;
    iVar3 = pStr->n;
  }
  memcpy(pOld + iVar3,zAppend,(long)nAppend);
  lVar2 = (long)pStr->n + (long)nAppend;
  pStr->n = (int)lVar2;
  pStr->z[lVar2] = '\0';
  return 0;
}

Assistant:

static int fts3StringAppend(
  StrBuffer *pStr,                /* Buffer to append to */
  const char *zAppend,            /* Pointer to data to append to buffer */
  int nAppend                     /* Size of zAppend in bytes (or -1) */
){
  if( nAppend<0 ){
    nAppend = (int)strlen(zAppend);
  }

  /* If there is insufficient space allocated at StrBuffer.z, use realloc()
  ** to grow the buffer until so that it is big enough to accomadate the
  ** appended data.
  */
  if( pStr->n+nAppend+1>=pStr->nAlloc ){
    int nAlloc = pStr->nAlloc+nAppend+100;
    char *zNew = sqlite3_realloc(pStr->z, nAlloc);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pStr->z = zNew;
    pStr->nAlloc = nAlloc;
  }
  assert( pStr->z!=0 && (pStr->nAlloc >= pStr->n+nAppend+1) );

  /* Append the data to the string buffer. */
  memcpy(&pStr->z[pStr->n], zAppend, nAppend);
  pStr->n += nAppend;
  pStr->z[pStr->n] = '\0';

  return SQLITE_OK;
}